

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_diag_sse41_128_32.c
# Opt level: O1

parasail_result_t *
parasail_sg_flags_table_diag_sse41_128_32
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix,
          int s1_beg,int s1_end,int s2_beg,int s2_end)

{
  int *piVar1;
  undefined1 auVar2 [12];
  undefined1 auVar3 [16];
  uint uVar4;
  int iVar5;
  parasail_result_t *ppVar6;
  int32_t *ptr;
  int32_t *ptr_00;
  int32_t *ptr_01;
  int32_t *ptr_02;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  int32_t *piVar11;
  int iVar12;
  ulong uVar13;
  int iVar14;
  ulong uVar15;
  uint uVar16;
  uint uVar17;
  int iVar18;
  ulong uVar19;
  uint uVar20;
  uint uVar21;
  int iVar22;
  int iVar26;
  int iVar27;
  int iVar28;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  int iVar29;
  int iVar33;
  int iVar34;
  int iVar35;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  int iVar39;
  undefined1 auVar38 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  uint uVar42;
  uint uVar44;
  uint uVar45;
  uint uVar46;
  undefined1 auVar43 [16];
  int iVar47;
  int iVar49;
  int iVar50;
  undefined1 in_XMM10 [16];
  undefined1 auVar48 [16];
  undefined1 in_XMM11 [16];
  int iVar51;
  int iVar54;
  int iVar55;
  int iVar56;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  __m128i vMaxHCol;
  __m128i vMaxHRow;
  uint local_1b8;
  uint uStack_1b4;
  uint uStack_1b0;
  uint uStack_1ac;
  undefined1 local_198 [16];
  long local_178;
  long local_170;
  long local_168;
  long local_160;
  int local_158;
  int iStack_154;
  int iStack_150;
  int iStack_14c;
  undefined1 local_148 [16];
  uint local_138;
  uint uStack_134;
  uint uStack_130;
  uint uStack_12c;
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  long local_e0;
  int *local_d8;
  int32_t *local_d0;
  ulong local_c8;
  ulong local_c0;
  int local_b8;
  int iStack_b4;
  int iStack_b0;
  int iStack_ac;
  undefined1 local_a8 [16];
  int local_98;
  int iStack_94;
  int iStack_90;
  int iStack_8c;
  int local_88;
  int iStack_84;
  int iStack_80;
  int iStack_7c;
  int local_78;
  int iStack_74;
  int iStack_70;
  int iStack_6c;
  int local_68;
  int iStack_64;
  int iStack_60;
  int iStack_5c;
  uint local_58;
  uint uStack_54;
  uint uStack_50;
  uint uStack_4c;
  int local_48;
  int iStack_44;
  int iStack_40;
  int iStack_3c;
  
  if (_s2 == (char *)0x0) {
    parasail_sg_flags_table_diag_sse41_128_32_cold_7();
    return (parasail_result_t *)0x0;
  }
  uVar19 = (ulong)(uint)s2Len;
  if (s2Len < 1) {
    parasail_sg_flags_table_diag_sse41_128_32_cold_6();
    return (parasail_result_t *)0x0;
  }
  if (open < 0) {
    parasail_sg_flags_table_diag_sse41_128_32_cold_5();
    return (parasail_result_t *)0x0;
  }
  if (gap < 0) {
    parasail_sg_flags_table_diag_sse41_128_32_cold_4();
    return (parasail_result_t *)0x0;
  }
  if (matrix == (parasail_matrix_t *)0x0) {
    parasail_sg_flags_table_diag_sse41_128_32_cold_3();
    return (parasail_result_t *)0x0;
  }
  if (matrix->type == 0) {
    if (_s1 == (char *)0x0) {
      parasail_sg_flags_table_diag_sse41_128_32_cold_2();
      return (parasail_result_t *)0x0;
    }
    if (_s1Len < 1) {
      parasail_sg_flags_table_diag_sse41_128_32_cold_1();
      return (parasail_result_t *)0x0;
    }
  }
  else {
    _s1Len = matrix->length;
  }
  iVar18 = _s1Len + 3;
  uVar4 = s2Len + 3;
  iVar14 = -open;
  iVar12 = matrix->min;
  uVar20 = 0x80000000 - iVar12;
  if (iVar12 != iVar14 && SBORROW4(iVar12,iVar14) == iVar12 + open < 0) {
    uVar20 = open | 0x80000000;
  }
  iVar12 = uVar20 + 1;
  uVar20 = 0x7ffffffe - matrix->max;
  local_158 = 0;
  iStack_154 = 0;
  iStack_150 = 0;
  iStack_14c = 0;
  if (s1_beg == 0) {
    local_b8 = gap << 2;
    iStack_b4 = gap << 2;
    iStack_b0 = gap << 2;
    iStack_ac = gap << 2;
  }
  else {
    local_b8 = 0;
    iStack_b4 = 0;
    iStack_b0 = 0;
    iStack_ac = 0;
  }
  local_f8._0_8_ = CONCAT44(iVar12,iVar12);
  local_f8._8_8_ = CONCAT44(iVar12,iVar12);
  local_108._8_8_ = local_f8._8_8_;
  local_108._0_8_ = local_f8._0_8_;
  local_118._8_8_ = local_f8._8_8_;
  local_118._0_8_ = local_f8._0_8_;
  local_148._8_8_ = local_f8._8_8_;
  local_148._0_8_ = local_f8._0_8_;
  local_128._8_8_ = local_f8._8_8_;
  local_128._0_8_ = local_f8._0_8_;
  if (s1_beg == 0) {
    iStack_150 = iVar14 - gap;
    iStack_154 = iVar14 + gap * -2;
    local_158 = -(gap * 3 + open);
    iStack_14c = iVar14;
  }
  local_48 = gap;
  iStack_44 = gap;
  iStack_40 = gap;
  iStack_3c = gap;
  ppVar6 = parasail_result_new_table1(_s1Len,s2Len);
  if (ppVar6 == (parasail_result_t *)0x0) {
    return (parasail_result_t *)0x0;
  }
  ppVar6->flag = (uint)(s1_end != 0) * 0x10 + (uint)(s1_beg != 0) * 8 | (uint)(s2_beg != 0) << 0xe |
                 (uint)(s2_end != 0) << 0xf | ppVar6->flag | 0x4421002;
  uVar9 = (ulong)(s2Len + 6);
  ptr = parasail_memalign_int32_t(0x10,uVar9);
  ptr_00 = parasail_memalign_int32_t(0x10,uVar9);
  ptr_01 = parasail_memalign_int32_t(0x10,uVar9);
  if (ptr_01 == (int32_t *)0x0 || (ptr_00 == (int32_t *)0x0 || ptr == (int32_t *)0x0)) {
    return (parasail_result_t *)0x0;
  }
  if (matrix->type == 0) {
    ptr_02 = parasail_memalign_int32_t(0x10,(long)iVar18);
    if (ptr_02 == (int32_t *)0x0) {
      return (parasail_result_t *)0x0;
    }
    if (0 < _s1Len) {
      piVar1 = matrix->mapper;
      uVar9 = 0;
      do {
        ptr_02[uVar9] = piVar1[(byte)_s1[uVar9]];
        uVar9 = uVar9 + 1;
      } while ((uint)_s1Len != uVar9);
    }
    iVar47 = _s1Len + 1U;
    if ((int)(_s1Len + 1U) < iVar18) {
      iVar47 = iVar18;
    }
    memset(ptr_02 + _s1Len,0,(ulong)(uint)(~_s1Len + iVar47) * 4 + 4);
  }
  else {
    ptr_02 = (int32_t *)0x0;
  }
  local_98 = _s1Len - 1;
  iStack_94 = _s1Len - 1;
  iStack_90 = _s1Len - 1;
  iStack_8c = _s1Len - 1;
  local_68 = s2Len + -1;
  iStack_64 = s2Len + -1;
  iStack_60 = s2Len + -1;
  iStack_5c = s2Len + -1;
  piVar1 = matrix->mapper;
  uVar9 = 1;
  if (1 < s2Len) {
    uVar9 = uVar19;
  }
  uVar10 = 0;
  do {
    ptr[uVar10 + 3] = piVar1[(byte)_s2[uVar10]];
    uVar10 = uVar10 + 1;
  } while (uVar9 != uVar10);
  ptr[2] = 0;
  ptr[0] = 0;
  ptr[1] = 0;
  uVar42 = s2Len + 1U;
  if ((int)(s2Len + 1U) < (int)uVar4) {
    uVar42 = uVar4;
  }
  local_138 = uVar20;
  uStack_134 = uVar20;
  uStack_130 = uVar20;
  uStack_12c = uVar20;
  local_88 = open;
  iStack_84 = open;
  iStack_80 = open;
  iStack_7c = open;
  local_78 = s2Len;
  iStack_74 = s2Len;
  iStack_70 = s2Len;
  iStack_6c = s2Len;
  local_58 = _s1Len;
  uStack_54 = _s1Len;
  uStack_50 = _s1Len;
  uStack_4c = _s1Len;
  memset(ptr + uVar19 + 3,0,(ulong)(~s2Len + uVar42) * 4 + 4);
  uVar9 = 1;
  if (1 < s2Len) {
    uVar9 = uVar19;
  }
  uVar10 = 0;
  iVar18 = iVar14;
  if (s2_beg == 0) {
    do {
      ptr_00[uVar10 + 3] = iVar18;
      ptr_01[uVar10 + 3] = iVar12;
      uVar10 = uVar10 + 1;
      iVar18 = iVar18 - gap;
    } while (uVar9 != uVar10);
  }
  else {
    do {
      ptr_00[uVar10 + 3] = 0;
      ptr_01[uVar10 + 3] = iVar12;
      uVar10 = uVar10 + 1;
    } while (uVar9 != uVar10);
  }
  lVar7 = 0;
  do {
    ptr_00[lVar7] = iVar12;
    ptr_01[lVar7] = iVar12;
    lVar7 = lVar7 + 1;
  } while (lVar7 != 3);
  lVar7 = uVar19 + 3;
  uVar9 = uVar19;
  do {
    ptr_00[lVar7] = iVar12;
    ptr_01[lVar7] = iVar12;
    lVar7 = lVar7 + 1;
    uVar20 = (int)uVar9 + 1;
    uVar9 = (ulong)uVar20;
  } while ((int)uVar20 < (int)uVar4);
  ptr_00[2] = 0;
  local_198._0_4_ = iVar12;
  local_198._4_4_ = iVar12;
  local_198._8_4_ = iVar12;
  local_198._12_4_ = iVar12;
  local_1b8 = local_138;
  uStack_1b4 = uStack_134;
  uStack_1b0 = uStack_130;
  uStack_1ac = uStack_12c;
  if (0 < _s1Len) {
    local_d8 = matrix->matrix;
    uVar20 = _s1Len - 1;
    auVar2._4_4_ = iVar12;
    auVar2._0_4_ = iVar12;
    auVar2._8_4_ = iVar12;
    local_198._0_12_ = auVar2;
    local_a8 = local_198 >> 0x20;
    auVar25 = local_a8;
    local_c0 = 1;
    if (1 < (int)uVar4) {
      local_c0 = (ulong)uVar4;
    }
    uVar9 = (ulong)(uint)_s1Len;
    local_e0 = uVar19 * 0x10;
    local_160 = uVar19 * 4 + -4;
    local_170 = uVar19 * 0xc + -0xc;
    local_178 = uVar19 * 8 + -8;
    auVar48 = pmovsxbd(in_XMM10,0x10203);
    local_168 = 0;
    local_c8 = 0;
    local_d0 = ptr_02;
    piVar11 = ptr_02;
    do {
      iVar18 = matrix->type;
      uVar42 = (uint)local_c8;
      uVar4 = uVar42;
      if (iVar18 == 0) {
        uVar4 = piVar11[local_c8];
      }
      uVar10 = local_c8 | 1;
      if (iVar18 == 0) {
        uVar16 = piVar11[uVar10];
      }
      else {
        uVar16 = uVar20;
        if (uVar10 < uVar9) {
          uVar16 = uVar42 | 1;
        }
      }
      uVar8 = local_c8 | 2;
      if (iVar18 == 0) {
        uVar21 = piVar11[uVar8];
      }
      else {
        uVar21 = uVar20;
        if (uVar8 < uVar9) {
          uVar21 = uVar42 | 2;
        }
      }
      uVar13 = local_c8 | 3;
      if (iVar18 == 0) {
        uVar17 = piVar11[uVar13];
      }
      else {
        uVar17 = uVar20;
        if (uVar13 < uVar9) {
          uVar17 = uVar42 | 3;
        }
      }
      iVar18 = matrix->size;
      local_c8 = local_c8 + 4;
      local_a8._0_8_ = auVar2._4_8_;
      auVar57._12_4_ = ptr_00[2];
      auVar57._8_4_ = iVar12;
      auVar57._0_8_ = local_a8._0_8_;
      ptr_00[2] = iVar14 - (int)local_c8 * gap;
      iVar47 = iVar14 - uVar42 * gap;
      if (s1_beg != 0) {
        iVar47 = 0;
      }
      auVar38._12_4_ = iVar47;
      auVar38._8_4_ = iVar12;
      auVar38._0_8_ = local_a8._0_8_;
      iVar47 = auVar48._0_4_;
      auVar60._0_4_ = -(uint)(local_98 == iVar47);
      iVar49 = auVar48._4_4_;
      auVar60._4_4_ = -(uint)(iStack_94 == iVar49);
      iVar50 = auVar48._8_4_;
      auVar60._8_4_ = -(uint)(iStack_90 == iVar50);
      iVar5 = auVar48._12_4_;
      auVar60._12_4_ = -(uint)(iStack_8c == iVar5);
      uVar15 = 0;
      in_XMM11 = pmovsxbd(in_XMM11,0xfffefd);
      auVar41._4_4_ = iVar12;
      auVar41._0_4_ = iVar12;
      auVar41._8_4_ = iVar12;
      auVar41._12_4_ = iVar12;
      auVar53 = auVar41;
      do {
        iVar39 = auVar38._12_4_;
        auVar59._0_8_ = auVar38._4_8_;
        auVar58._0_12_ = auVar38._4_12_;
        auVar58._12_4_ = iVar39;
        auVar59._8_8_ = auVar58._8_8_ & 0xffffffff | (ulong)(uint)ptr_00[uVar15 + 3] << 0x20;
        iVar29 = local_d8[(long)(int)(uVar17 * iVar18) + (long)ptr[uVar15]] + auVar57._0_4_;
        iVar33 = local_d8[(long)(int)(uVar21 * iVar18) + (long)ptr[uVar15 + 1]] + auVar57._4_4_;
        iVar34 = local_d8[(long)(int)(uVar16 * iVar18) + (long)ptr[uVar15 + 2]] + auVar57._8_4_;
        iVar35 = local_d8[(long)(int)(uVar4 * iVar18) + (long)ptr[uVar15 + 3]] + auVar57._12_4_;
        iVar22 = auVar38._4_4_ - local_88;
        iVar26 = auVar38._8_4_ - iStack_84;
        iVar27 = iVar39 - iStack_80;
        iVar28 = ptr_00[uVar15 + 3] - iStack_7c;
        iVar51 = auVar53._4_4_ - local_48;
        iVar54 = auVar53._8_4_ - iStack_44;
        iVar55 = auVar53._12_4_ - iStack_40;
        iVar56 = ptr_01[uVar15 + 3] - iStack_3c;
        auVar52._0_4_ = (uint)(iVar51 < iVar22) * iVar22 | (uint)(iVar51 >= iVar22) * iVar51;
        auVar52._4_4_ = (uint)(iVar54 < iVar26) * iVar26 | (uint)(iVar54 >= iVar26) * iVar54;
        auVar52._8_4_ = (uint)(iVar55 < iVar27) * iVar27 | (uint)(iVar55 >= iVar27) * iVar55;
        auVar52._12_4_ = (uint)(iVar56 < iVar28) * iVar28 | (uint)(iVar56 >= iVar28) * iVar56;
        iVar22 = auVar38._0_4_ - local_88;
        iVar26 = auVar38._4_4_ - iStack_84;
        iVar27 = auVar38._8_4_ - iStack_80;
        iVar39 = iVar39 - iStack_7c;
        iVar28 = auVar41._0_4_ - local_48;
        iVar51 = auVar41._4_4_ - iStack_44;
        iVar54 = auVar41._8_4_ - iStack_40;
        iVar55 = auVar41._12_4_ - iStack_3c;
        auVar40._0_4_ = (uint)(iVar28 < iVar22) * iVar22 | (uint)(iVar28 >= iVar22) * iVar28;
        auVar40._4_4_ = (uint)(iVar51 < iVar26) * iVar26 | (uint)(iVar51 >= iVar26) * iVar51;
        auVar40._8_4_ = (uint)(iVar54 < iVar27) * iVar27 | (uint)(iVar54 >= iVar27) * iVar54;
        auVar40._12_4_ = (uint)(iVar55 < iVar39) * iVar39 | (uint)(iVar55 >= iVar39) * iVar55;
        uVar42 = ((int)auVar40._0_4_ < (int)auVar52._0_4_) * auVar52._0_4_ |
                 ((int)auVar40._0_4_ >= (int)auVar52._0_4_) * auVar40._0_4_;
        uVar44 = ((int)auVar40._4_4_ < (int)auVar52._4_4_) * auVar52._4_4_ |
                 ((int)auVar40._4_4_ >= (int)auVar52._4_4_) * auVar40._4_4_;
        uVar45 = ((int)auVar40._8_4_ < (int)auVar52._8_4_) * auVar52._8_4_ |
                 ((int)auVar40._8_4_ >= (int)auVar52._8_4_) * auVar40._8_4_;
        uVar46 = ((int)auVar40._12_4_ < (int)auVar52._12_4_) * auVar52._12_4_ |
                 ((int)auVar40._12_4_ >= (int)auVar52._12_4_) * auVar40._12_4_;
        auVar43._0_4_ = (uint)((int)uVar42 < iVar29) * iVar29 | ((int)uVar42 >= iVar29) * uVar42;
        auVar43._4_4_ = (uint)((int)uVar44 < iVar33) * iVar33 | ((int)uVar44 >= iVar33) * uVar44;
        auVar43._8_4_ = (uint)((int)uVar45 < iVar34) * iVar34 | ((int)uVar45 >= iVar34) * uVar45;
        auVar43._12_4_ = (uint)((int)uVar46 < iVar35) * iVar35 | ((int)uVar46 >= iVar35) * uVar46;
        iVar29 = in_XMM11._0_4_;
        auVar23._0_4_ = -(uint)(iVar29 == -1);
        iVar33 = in_XMM11._4_4_;
        auVar23._4_4_ = -(uint)(iVar33 == -1);
        iVar34 = in_XMM11._8_4_;
        iVar35 = in_XMM11._12_4_;
        auVar23._8_4_ = -(uint)(iVar34 == -1);
        auVar23._12_4_ = -(uint)(iVar35 == -1);
        auVar53._4_4_ = iStack_154;
        auVar53._0_4_ = local_158;
        auVar53._8_4_ = iStack_150;
        auVar53._12_4_ = iStack_14c;
        auVar38 = blendvps(auVar43,auVar53,auVar23);
        auVar3._4_4_ = iVar12;
        auVar3._0_4_ = iVar12;
        auVar3._8_4_ = iVar12;
        auVar3._12_4_ = iVar12;
        auVar53 = blendvps(auVar52,auVar3,auVar23);
        auVar41 = blendvps(auVar40,auVar3,auVar23);
        iVar22 = auVar38._0_4_;
        iVar26 = auVar38._4_4_;
        iVar28 = auVar38._12_4_;
        iVar27 = auVar38._8_4_;
        if (3 < uVar15) {
          local_1b8 = (uint)(iVar22 < (int)local_1b8) * iVar22 |
                      (iVar22 >= (int)local_1b8) * local_1b8;
          uStack_1b4 = (uint)(iVar26 < (int)uStack_1b4) * iVar26 |
                       (iVar26 >= (int)uStack_1b4) * uStack_1b4;
          uStack_1b0 = (uint)(iVar27 < (int)uStack_1b0) * iVar27 |
                       (iVar27 >= (int)uStack_1b0) * uStack_1b0;
          uStack_1ac = (uint)(iVar28 < (int)uStack_1ac) * iVar28 |
                       (iVar28 >= (int)uStack_1ac) * uStack_1ac;
          local_198._4_4_ =
               (uint)((int)local_198._4_4_ < iVar26) * iVar26 |
               (uint)((int)local_198._4_4_ >= iVar26) * local_198._4_4_;
          local_198._0_4_ =
               (uint)((int)local_198._0_4_ < iVar22) * iVar22 |
               (uint)((int)local_198._0_4_ >= iVar22) * local_198._0_4_;
          local_198._8_4_ =
               (uint)((int)local_198._8_4_ < iVar27) * iVar27 |
               (uint)((int)local_198._8_4_ >= iVar27) * local_198._8_4_;
          local_198._12_4_ =
               (uint)((int)local_198._12_4_ < iVar28) * iVar28 |
               (uint)((int)local_198._12_4_ >= iVar28) * local_198._12_4_;
        }
        piVar1 = ((ppVar6->field_4).rowcols)->score_row;
        if (uVar15 < uVar19) {
          *(int *)((long)piVar1 + uVar15 * 4 + local_168) = iVar28;
        }
        if (uVar15 - 1 < uVar19 && uVar10 < uVar9) {
          *(int *)((long)piVar1 + uVar15 * 4 + local_160) = iVar27;
        }
        if ((uVar8 < uVar9) && ((long)(uVar15 - 2) < (long)uVar19 && 1 < uVar15)) {
          *(int *)((long)piVar1 + uVar15 * 4 + local_178) = iVar26;
        }
        if ((uVar13 < uVar9) && ((long)(uVar15 - 3) < (long)uVar19 && 2 < uVar15)) {
          *(int *)((long)piVar1 + uVar15 * 4 + local_170) = iVar22;
        }
        auVar30._0_4_ = -(uint)(iVar47 < (int)local_58);
        auVar30._4_4_ = -(uint)(iVar49 < (int)uStack_54);
        auVar30._8_4_ = -(uint)(iVar50 < (int)uStack_50);
        auVar30._12_4_ = -(uint)(iVar5 < (int)uStack_4c);
        ptr_00[uVar15] = iVar22;
        ptr_01[uVar15] = auVar53._0_4_;
        auVar36._0_4_ = -(uint)(local_68 == iVar29);
        auVar36._4_4_ = -(uint)(iStack_64 == iVar33);
        auVar36._8_4_ = -(uint)(iStack_60 == iVar34);
        auVar36._12_4_ = -(uint)(iStack_5c == iVar35);
        auVar24._0_4_ = -(uint)(iVar29 < local_78);
        auVar24._4_4_ = -(uint)(iVar33 < iStack_74);
        auVar24._8_4_ = -(uint)(iVar34 < iStack_70);
        auVar24._12_4_ = -(uint)(iVar35 < iStack_6c);
        auVar37._0_4_ = -(uint)(local_f8._0_4_ < iVar22);
        auVar37._4_4_ = -(uint)(local_f8._4_4_ < iVar26);
        auVar37._8_4_ = -(uint)(local_f8._8_4_ < iVar27);
        auVar37._12_4_ = -(uint)(local_f8._12_4_ < iVar28);
        auVar37 = ~in_XMM11 & auVar24 & auVar60 & auVar37;
        local_f8 = blendvps(local_f8,auVar43,auVar37);
        auVar31._0_4_ = -(uint)(local_108._0_4_ < iVar22);
        auVar31._4_4_ = -(uint)(local_108._4_4_ < iVar26);
        auVar31._8_4_ = -(uint)(local_108._8_4_ < iVar27);
        auVar31._12_4_ = -(uint)(local_108._12_4_ < iVar28);
        auVar31 = auVar30 & auVar36 & auVar31;
        local_108 = blendvps(local_108,auVar38,auVar31);
        local_118 = blendvps(local_118,auVar38,auVar36 & auVar60);
        local_148 = blendvps(local_148,auVar48,auVar31);
        local_128 = blendvps(local_128,in_XMM11,auVar37);
        in_XMM11._0_4_ = iVar29 + 1;
        in_XMM11._4_4_ = iVar33 + 1;
        in_XMM11._8_4_ = iVar34 + 1;
        in_XMM11._12_4_ = iVar35 + 1;
        uVar15 = uVar15 + 1;
        auVar57 = auVar59;
      } while (local_c0 != uVar15);
      auVar48._0_4_ = iVar47 + 4;
      auVar48._4_4_ = iVar49 + 4;
      auVar48._8_4_ = iVar50 + 4;
      auVar48._12_4_ = iVar5 + 4;
      local_158 = local_158 - local_b8;
      iStack_154 = iStack_154 - iStack_b4;
      iStack_150 = iStack_150 - iStack_b0;
      iStack_14c = iStack_14c - iStack_ac;
      local_168 = local_168 + local_e0;
      local_160 = local_160 + local_e0;
      local_170 = local_170 + local_e0;
      local_178 = local_178 + local_e0;
      piVar11 = local_d0;
    } while (local_c8 < uVar9);
    local_a8 = auVar25;
  }
  lVar7 = 0;
  iVar14 = 0;
  iVar18 = 0;
  iVar47 = iVar12;
  iVar49 = iVar12;
  iVar50 = iVar12;
  do {
    iVar5 = *(int *)(local_108 + lVar7 * 4);
    if ((iVar49 < iVar5) || ((iVar5 == iVar49 && (*(int *)(local_148 + lVar7 * 4) < iVar14)))) {
      iVar14 = *(int *)(local_148 + lVar7 * 4);
      iVar49 = iVar5;
    }
    if (iVar50 < *(int *)(local_f8 + lVar7 * 4)) {
      iVar18 = *(int *)(local_128 + lVar7 * 4);
      iVar50 = *(int *)(local_f8 + lVar7 * 4);
    }
    if (iVar47 < *(int *)(local_118 + lVar7 * 4)) {
      iVar47 = *(int *)(local_118 + lVar7 * 4);
    }
    lVar7 = lVar7 + 1;
  } while ((int)lVar7 != 4);
  if (s1_end == 0 || s2_end == 0) {
    if (s1_end != 0) goto LAB_0069a7e3;
    iVar5 = s2Len + -1;
    if (s2_end != 0) {
      iVar5 = iVar18;
      iVar47 = iVar50;
    }
  }
  else if ((iVar50 < iVar49) ||
          (iVar5 = iVar18, iVar47 = iVar50, s2Len + -1 == iVar18 && iVar49 == iVar50)) {
LAB_0069a7e3:
    iVar5 = s2Len + -1;
    goto LAB_0069a837;
  }
  iVar49 = iVar47;
  iVar14 = _s1Len - 1;
LAB_0069a837:
  auVar25._0_4_ = -(uint)((int)local_1b8 < iVar12);
  auVar25._4_4_ = -(uint)((int)uStack_1b4 < iVar12);
  auVar25._8_4_ = -(uint)((int)uStack_1b0 < iVar12);
  auVar25._12_4_ = -(uint)((int)uStack_1ac < iVar12);
  auVar32._0_4_ = -(uint)((int)local_138 < (int)local_198._0_4_);
  auVar32._4_4_ = -(uint)((int)uStack_134 < (int)local_198._4_4_);
  auVar32._8_4_ = -(uint)((int)uStack_130 < (int)local_198._8_4_);
  auVar32._12_4_ = -(uint)((int)uStack_12c < (int)local_198._12_4_);
  iVar12 = movmskps(iVar50,auVar32 | auVar25);
  if (iVar12 != 0) {
    *(byte *)&ppVar6->flag = (byte)ppVar6->flag | 0x40;
    iVar49 = 0;
    iVar5 = 0;
    iVar14 = 0;
  }
  ppVar6->score = iVar49;
  ppVar6->end_query = iVar14;
  ppVar6->end_ref = iVar5;
  parasail_free(ptr_01);
  parasail_free(ptr_00);
  parasail_free(ptr);
  if (matrix->type == 0) {
    parasail_free(ptr_02);
    return ppVar6;
  }
  return ppVar6;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t N = 0;
    int32_t PAD = 0;
    int32_t PAD2 = 0;
    int32_t s1Len = 0;
    int32_t s1Len_PAD = 0;
    int32_t s2Len_PAD = 0;
    int32_t * restrict s1 = NULL;
    int32_t * restrict s2B = NULL;
    int32_t * restrict _H_pr = NULL;
    int32_t * restrict _F_pr = NULL;
    int32_t * restrict s2 = NULL;
    int32_t * restrict H_pr = NULL;
    int32_t * restrict F_pr = NULL;
    parasail_result_t *result = NULL;
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t NEG_LIMIT = 0;
    int32_t POS_LIMIT = 0;
    int32_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vNegInf;
    __m128i vOpen;
    __m128i vGap;
    __m128i vOne;
    __m128i vN;
    __m128i vGapN;
    __m128i vNegOne;
    __m128i vI;
    __m128i vJreset;
    __m128i vMaxHRow;
    __m128i vMaxHCol;
    __m128i vLastVal;
    __m128i vEndI;
    __m128i vEndJ;
    __m128i vILimit;
    __m128i vILimit1;
    __m128i vJLimit;
    __m128i vJLimit1;
    __m128i vIBoundary;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    N = 4; /* number of values in vector */
    PAD = N-1;
    PAD2 = PAD*2;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    s1Len_PAD = s1Len+PAD;
    s2Len_PAD = s2Len+PAD;
    i = 0;
    j = 0;
    end_query = 0;
    end_ref = 0;
    NEG_LIMIT = (-open < matrix->min ? INT32_MIN + open : INT32_MIN - matrix->min) + 1;
    POS_LIMIT = INT32_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi32(NEG_LIMIT);
    vPosLimit = _mm_set1_epi32(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInf = _mm_set1_epi32(NEG_LIMIT);
    vOpen = _mm_set1_epi32(open);
    vGap  = _mm_set1_epi32(gap);
    vOne = _mm_set1_epi32(1);
    vN = _mm_set1_epi32(N);
    vGapN = s1_beg ? _mm_set1_epi32(0) : _mm_set1_epi32(gap*N);
    vNegOne = _mm_set1_epi32(-1);
    vI = _mm_set_epi32(0,1,2,3);
    vJreset = _mm_set_epi32(0,-1,-2,-3);
    vMaxHRow = vNegInf;
    vMaxHCol = vNegInf;
    vLastVal = vNegInf;
    vEndI = vNegInf;
    vEndJ = vNegInf;
    vILimit = _mm_set1_epi32(s1Len);
    vILimit1 = _mm_sub_epi32(vILimit, vOne);
    vJLimit = _mm_set1_epi32(s2Len);
    vJLimit1 = _mm_sub_epi32(vJLimit, vOne);
    vIBoundary = s1_beg ? _mm_set1_epi32(0) : _mm_set_epi32(
            -open-0*gap,
            -open-1*gap,
            -open-2*gap,
            -open-3*gap);

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(s1Len, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_DIAG
        | PARASAIL_FLAG_BITS_32 | PARASAIL_FLAG_LANES_4;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s2B= parasail_memalign_int32_t(16, s2Len+PAD2);
    _H_pr = parasail_memalign_int32_t(16, s2Len+PAD2);
    _F_pr = parasail_memalign_int32_t(16, s2Len+PAD2);
    s2 = s2B+PAD; /* will allow later for negative indices */
    H_pr = _H_pr+PAD;
    F_pr = _F_pr+PAD;

    /* validate heap variables */
    if (!s2B) return NULL;
    if (!_H_pr) return NULL;
    if (!_F_pr) return NULL;

    /* convert _s1 from char to int in range 0-23 */
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        s1 = parasail_memalign_int32_t(16, s1Len+PAD);
        if (!s1) return NULL;
        for (i=0; i<s1Len; ++i) {
            s1[i] = matrix->mapper[(unsigned char)_s1[i]];
        }
        /* pad back of s1 with dummy values */
        for (i=s1Len; i<s1Len_PAD; ++i) {
            s1[i] = 0; /* point to first matrix row because we don't care */
        }
    }

    /* convert _s2 from char to int in range 0-23 */
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }
    /* pad front of s2 with dummy values */
    for (j=-PAD; j<0; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }
    /* pad back of s2 with dummy values */
    for (j=s2Len; j<s2Len_PAD; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }

    /* set initial values for stored row */
    if (s2_beg) {
        for (j=0; j<s2Len; ++j) {
            H_pr[j] = 0;
            F_pr[j] = NEG_LIMIT;
        }
    }
    else {
        for (j=0; j<s2Len; ++j) {
            H_pr[j] = -open - j*gap;
            F_pr[j] = NEG_LIMIT;
        }
    }
    /* pad front of stored row values */
    for (j=-PAD; j<0; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad back of stored row values */
    for (j=s2Len; j<s2Len+PAD; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    H_pr[-1] = 0; /* upper left corner */

    /* iterate over query sequence */
    for (i=0; i<s1Len; i+=N) {
        __m128i vNH = vNegInf;
        __m128i vWH = vNegInf;
        __m128i vE = vNegInf;
        __m128i vF = vNegInf;
        __m128i vJ = vJreset;
        const int * const restrict matrow0 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+0] : ((i+0 >= s1Len) ? s1Len-1 : i+0))];
        const int * const restrict matrow1 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+1] : ((i+1 >= s1Len) ? s1Len-1 : i+1))];
        const int * const restrict matrow2 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+2] : ((i+2 >= s1Len) ? s1Len-1 : i+2))];
        const int * const restrict matrow3 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+3] : ((i+3 >= s1Len) ? s1Len-1 : i+3))];
        __m128i vIltLimit = _mm_cmplt_epi32(vI, vILimit);
        __m128i vIeqLimit1 = _mm_cmpeq_epi32(vI, vILimit1);
        vNH = _mm_srli_si128(vNH, 4);
        vNH = _mm_insert_epi32(vNH, H_pr[-1], 3);
        vWH = _mm_srli_si128(vWH, 4);
        vWH = _mm_insert_epi32(vWH, s1_beg ? 0 : (-open - i*gap), 3);
        H_pr[-1] = -open - (i+N)*gap;
        /* iterate over database sequence */
        for (j=0; j<s2Len+PAD; ++j) {
            __m128i vMat;
            __m128i vNWH = vNH;
            vNH = _mm_srli_si128(vWH, 4);
            vNH = _mm_insert_epi32(vNH, H_pr[j], 3);
            vF = _mm_srli_si128(vF, 4);
            vF = _mm_insert_epi32(vF, F_pr[j], 3);
            vF = _mm_max_epi32(
                    _mm_sub_epi32(vNH, vOpen),
                    _mm_sub_epi32(vF, vGap));
            vE = _mm_max_epi32(
                    _mm_sub_epi32(vWH, vOpen),
                    _mm_sub_epi32(vE, vGap));
            vMat = _mm_set_epi32(
                    matrow0[s2[j-0]],
                    matrow1[s2[j-1]],
                    matrow2[s2[j-2]],
                    matrow3[s2[j-3]]
                    );
            vNWH = _mm_add_epi32(vNWH, vMat);
            vWH = _mm_max_epi32(vNWH, vE);
            vWH = _mm_max_epi32(vWH, vF);
            /* as minor diagonal vector passes across the j=-1 boundary,
             * assign the appropriate boundary conditions */
            {
                __m128i cond = _mm_cmpeq_epi32(vJ,vNegOne);
                vWH = _mm_blendv_epi8(vWH, vIBoundary, cond);
                vF = _mm_blendv_epi8(vF, vNegInf, cond);
                vE = _mm_blendv_epi8(vE, vNegInf, cond);
            }
            /* cannot start checking sat until after J clears boundary */
            if (j > PAD) {
                vSaturationCheckMin = _mm_min_epi32(vSaturationCheckMin, vWH);
                vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vWH);
            }
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vWH, i, s1Len, j, s2Len);
#endif
#ifdef PARASAIL_ROWCOL
            arr_store_rowcol(result->rowcols->score_row, result->rowcols->score_col, vWH, i, s1Len, j, s2Len);
#endif
            H_pr[j-3] = (int32_t)_mm_extract_epi32(vWH,0);
            F_pr[j-3] = (int32_t)_mm_extract_epi32(vF,0);
            /* as minor diagonal vector passes across the i or j limit
             * boundary, extract the last value of the column or row */
            {
                __m128i vJeqLimit1 = _mm_cmpeq_epi32(vJ, vJLimit1);
                __m128i vJgtNegOne = _mm_cmpgt_epi32(vJ, vNegOne);
                __m128i vJltLimit = _mm_cmplt_epi32(vJ, vJLimit);
                __m128i cond_j = _mm_and_si128(vIltLimit, vJeqLimit1);
                __m128i cond_i = _mm_and_si128(vIeqLimit1,
                        _mm_and_si128(vJgtNegOne, vJltLimit));
                __m128i cond_max_row = _mm_cmpgt_epi32(vWH, vMaxHRow);
                __m128i cond_max_col = _mm_cmpgt_epi32(vWH, vMaxHCol);
                __m128i cond_last_val = _mm_and_si128(vIeqLimit1, vJeqLimit1);
                __m128i cond_all_row = _mm_and_si128(cond_max_row, cond_i);
                __m128i cond_all_col = _mm_and_si128(cond_max_col, cond_j);
                vMaxHRow = _mm_blendv_epi8(vMaxHRow, vWH, cond_all_row);
                vMaxHCol = _mm_blendv_epi8(vMaxHCol, vWH, cond_all_col);
                vLastVal = _mm_blendv_epi8(vLastVal, vWH, cond_last_val);
                vEndI = _mm_blendv_epi8(vEndI, vI, cond_all_col);
                vEndJ = _mm_blendv_epi8(vEndJ, vJ, cond_all_row);
            }
            vJ = _mm_add_epi32(vJ, vOne);
        }
        vI = _mm_add_epi32(vI, vN);
        vIBoundary = _mm_sub_epi32(vIBoundary, vGapN);
    }

    /* alignment ending position */
    {
        int32_t max_row = NEG_LIMIT;
        int32_t max_col = NEG_LIMIT;
        int32_t last_val = NEG_LIMIT;
        int32_t *s = (int32_t*)&vMaxHRow;
        int32_t *t = (int32_t*)&vMaxHCol;
        int32_t *u = (int32_t*)&vLastVal;
        int32_t *i = (int32_t*)&vEndI;
        int32_t *j = (int32_t*)&vEndJ;
        int32_t k;
        for (k=0; k<N; ++k, ++s, ++t, ++u, ++i, ++j) {
            if (*t > max_col || (*t == max_col && *i < end_query)) {
                max_col = *t;
                end_query = *i;
            }
            if (*s > max_row) {
                max_row = *s;
                end_ref = *j;
            }
            if (*u > last_val) {
                last_val = *u;
            }
        }
        if (s1_end && s2_end) {
            if (max_col > max_row || (max_col == max_row && end_ref == s2Len-1)) {
                score = max_col;
                end_ref = s2Len-1;
            }
            else {
                score = max_row;
                end_query = s1Len-1;
            }
        }
        else if (s1_end) {
            score = max_col;
            end_ref = s2Len-1;
        }
        else if (s2_end) {
            score = max_row;
            end_query = s1Len-1;
        }
        else {
            score = last_val;
            end_query = s1Len-1;
            end_ref = s2Len-1;
        }
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi32(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi32(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(_F_pr);
    parasail_free(_H_pr);
    parasail_free(s2B);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        parasail_free(s1);
    }

    return result;
}